

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11JsonConfig.cpp
# Opt level: O2

json __thiscall helics::getSection(helics *this,json *base,string *subSection,int16_t configIndex)

{
  reference pvVar1;
  size_type sVar2;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value jVar3;
  json jVar4;
  initializer_list_t init;
  value_type cfg;
  value_type sub1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  key_type local_48;
  
  if (subSection->_M_string_length == 0) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)this,base);
    jVar3 = extraout_RDX;
    goto LAB_002f1706;
  }
  std::__cxx11::string::string((string *)&local_48,subSection);
  pvVar1 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::operator[](base,&local_48);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json(&cfg,pvVar1);
  std::__cxx11::string::~string((string *)&local_48);
  if (cfg.m_data.m_type == null) {
    sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find(subSection,'.',0);
    if (sVar2 != 0xffffffffffffffff) {
      sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find(subSection,'.',0);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_68,subSection,0,sVar2);
      pvVar1 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::operator[](base,&local_68);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&sub1,pvVar1);
      std::__cxx11::string::~string((string *)&local_68);
      if (sub1.m_data.m_type != null) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_88,subSection,sVar2 + 1,0xffffffffffffffff);
        getSection(this,&sub1,&local_88,configIndex);
        std::__cxx11::string::~string((string *)&local_88);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&sub1.m_data);
        goto LAB_002f16fe;
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&sub1.m_data);
    }
LAB_002f16f2:
    init._M_len = 0;
    init._M_array = (iterator)this;
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::object(init);
  }
  else if (cfg.m_data.m_type == array) {
    pvVar1 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::operator[](&cfg,(long)configIndex);
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)this,pvVar1);
  }
  else {
    if (cfg.m_data.m_type != object) goto LAB_002f16f2;
    *(ulong *)this = CONCAT71(cfg.m_data._1_7_,1);
    *(json_value *)(this + 8) = cfg.m_data.m_value;
    cfg.m_data.m_type = null;
    cfg.m_data.m_value.object = (object_t *)0x0;
  }
LAB_002f16fe:
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&cfg.m_data);
  jVar3 = extraout_RDX_00;
LAB_002f1706:
  jVar4.m_data.m_value.object = jVar3.object;
  jVar4.m_data._0_8_ = this;
  return (json)jVar4.m_data;
}

Assistant:

static nlohmann::json
    getSection(nlohmann::json& base, const std::string& subSection, int16_t configIndex)
{
    if (!subSection.empty()) {
        auto cfg = base[subSection];
        if (cfg.is_object()) {
            return cfg;
        }
        if (cfg.is_array()) {
            return cfg[configIndex];
        }
        if (cfg.is_null() && subSection.find_first_of('.') != std::string::npos) {
            auto dotloc = subSection.find_first_of('.');
            auto sub1 = base[subSection.substr(0, dotloc)];
            if (!sub1.is_null()) {
                return getSection(sub1, subSection.substr(dotloc + 1), configIndex);
            }
        }
        return nlohmann::json::object();
    }
    return base;
}